

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O0

void __thiscall kratos::SwitchStmt::~SwitchStmt(SwitchStmt *this)

{
  SwitchStmt *this_local;
  
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0058daf8;
  std::
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  ::~map(&this->body_);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr(&this->target_stmt_);
  std::shared_ptr<kratos::Var>::~shared_ptr(&this->target_);
  Stmt::~Stmt(&this->super_Stmt);
  return;
}

Assistant:

explicit SwitchStmt(const std::shared_ptr<Var> &target) : SwitchStmt(*target) {}